

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PArena.cpp
# Opt level: O3

void * __thiscall amrex::PArena::alloc(PArena *this,size_t nbytes)

{
  int iVar1;
  Arena *pAVar2;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  
  pAVar2 = The_Arena();
  iVar1 = (*pAVar2->_vptr_Arena[2])(pAVar2,nbytes,extraout_RDX,pAVar2->_vptr_Arena[2]);
  return (void *)CONCAT44(extraout_var,iVar1);
}

Assistant:

void*
PArena::alloc (std::size_t nbytes)
{
#if defined(AMREX_USE_GPU)

#ifdef AMREX_CUDA_GE_11_2
    if (Gpu::Device::memoryPoolsSupported()) {
        void* p;
        AMREX_CUDA_SAFE_CALL(cudaMallocAsync(&p, nbytes, m_pool, Gpu::gpuStream()));
        return p;
    } else
#endif
    {
        return The_Arena()->alloc(nbytes);
    }

#elif defined(AMREX_USE_OMP)

    if (omp_in_parallel()) {
        return amrex_mempool_alloc(nbytes);
    } else {
        return The_Arena()->alloc(nbytes);
    }

#else

    return The_Arena()->alloc(nbytes);

#endif
}